

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

void __thiscall
leveldb::SkipList<unsigned_long,_leveldb::Comparator>::SkipList
          (SkipList<unsigned_long,_leveldb::Comparator> *this,Arena *param_2)

{
  Node *pNVar1;
  long lVar2;
  
  this->arena_ = param_2;
  pNVar1 = (Node *)Arena::AllocateAligned(param_2,0x68);
  pNVar1->key = 0;
  this->head_ = pNVar1;
  this->max_height_ = (__atomic_base<int>)0x1;
  this->rnd_ = 0x5eadbeef;
  lVar2 = 1;
  do {
    this->head_->next_[lVar2 + -1]._M_b._M_p = (__pointer_type)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xd);
  return;
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}